

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O1

void uavs3d_if_hor_ver_luma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  sbyte sVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  undefined1 *puVar15;
  ulong uVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  long lVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  pel *ppVar24;
  undefined1 *puVar25;
  bool bVar26;
  pel *local_8758;
  undefined1 local_8738 [34568];
  
  sVar10 = (max_val != 0xff) * '\x02';
  cVar9 = (max_val == 0xff) * '\x02';
  ppVar24 = src + i_src * -3;
  if (max_val == 0xff) {
    if (-7 < height) {
      iVar12 = height + 3;
      if (iVar12 < -2) {
        iVar12 = -3;
      }
      puVar15 = local_8738;
      iVar13 = -3;
      do {
        if (0 < width) {
          cVar1 = *coeff_h;
          cVar2 = coeff_h[1];
          cVar3 = coeff_h[2];
          cVar4 = coeff_h[3];
          cVar5 = coeff_h[4];
          cVar6 = coeff_h[5];
          cVar7 = coeff_h[6];
          cVar8 = coeff_h[7];
          uVar16 = 0;
          do {
            *(ushort *)(puVar15 + uVar16 * 2) =
                 (ushort)ppVar24[uVar16 + 4] * (short)cVar8 +
                 (ushort)ppVar24[uVar16 + 3] * (short)cVar7 +
                 (ushort)ppVar24[uVar16 + 2] * (short)cVar6 +
                 (ushort)ppVar24[uVar16 + 1] * (short)cVar5 +
                 (ushort)ppVar24[uVar16] * (short)cVar4 + (ushort)ppVar24[uVar16 - 1] * (short)cVar3
                 + (ushort)ppVar24[uVar16 - 2] * (short)cVar2 +
                   (ushort)ppVar24[uVar16 - 3] * (short)cVar1;
            uVar16 = uVar16 + 1;
          } while ((uint)width != uVar16);
        }
        ppVar24 = ppVar24 + i_src;
        puVar15 = puVar15 + (long)width * 2;
        bVar26 = iVar13 != iVar12;
        iVar13 = iVar13 + 1;
      } while (bVar26);
    }
  }
  else if (-7 < height) {
    iVar12 = height + 3;
    if (iVar12 < -2) {
      iVar12 = -3;
    }
    puVar15 = local_8738;
    iVar13 = -3;
    do {
      if (0 < width) {
        cVar1 = *coeff_h;
        cVar2 = coeff_h[1];
        cVar3 = coeff_h[2];
        cVar4 = coeff_h[3];
        cVar5 = coeff_h[4];
        cVar6 = coeff_h[5];
        cVar7 = coeff_h[6];
        cVar8 = coeff_h[7];
        uVar16 = 0;
        do {
          *(short *)(puVar15 + uVar16 * 2) =
               (short)((int)((uint)ppVar24[uVar16 + 4] * (int)cVar8 +
                             (uint)ppVar24[uVar16 + 3] * (int)cVar7 +
                            (uint)ppVar24[uVar16 + 2] * (int)cVar6 +
                            (uint)ppVar24[uVar16 + 1] * (int)cVar5 +
                            (uint)ppVar24[uVar16] * (int)cVar4 +
                            (uint)ppVar24[uVar16 - 1] * (int)cVar3 +
                            (uint)ppVar24[uVar16 - 2] * (int)cVar2 +
                            (uint)ppVar24[uVar16 - 3] * (int)cVar1 + ((uint)(1 << sVar10) >> 1)) >>
                      sVar10);
          uVar16 = uVar16 + 1;
        } while ((uint)width != uVar16);
      }
      ppVar24 = ppVar24 + i_src;
      puVar15 = puVar15 + (long)width * 2;
      bVar26 = iVar13 != iVar12;
      iVar13 = iVar13 + 1;
    } while (bVar26);
  }
  if (0 < height) {
    lVar14 = (long)(width * 3);
    puVar17 = local_8738 + lVar14 * 2;
    lVar19 = (long)width;
    lVar11 = lVar14 * 2;
    puVar25 = local_8738 + lVar11 + (long)(width * 4) * 2;
    puVar22 = local_8738 + lVar14 * 4;
    puVar23 = local_8738 + (long)(width * 2) * 2 + lVar14 * 2;
    lVar14 = lVar19 * 2;
    puVar21 = local_8738 + lVar11 + lVar19 * 2;
    puVar20 = local_8738 + lVar11 + lVar19 * -2;
    puVar18 = local_8738 + lVar11 + (long)(width * 2) * -2;
    iVar12 = 0;
    puVar15 = local_8738;
    local_8758 = dst;
    do {
      if (0 < width) {
        uVar16 = 0;
        do {
          iVar13 = (int)coeff_v[7] * (int)*(short *)(puVar25 + uVar16 * 2) +
                   (int)coeff_v[6] * (int)*(short *)(puVar22 + uVar16 * 2) +
                   (int)coeff_v[5] * (int)*(short *)(puVar23 + uVar16 * 2) +
                   (int)coeff_v[4] * (int)*(short *)(puVar21 + uVar16 * 2) +
                   (int)coeff_v[3] * (int)*(short *)(puVar17 + uVar16 * 2) +
                   (int)coeff_v[2] * (int)*(short *)(puVar20 + uVar16 * 2) +
                   (int)coeff_v[1] * (int)*(short *)(puVar18 + uVar16 * 2) +
                   (int)*coeff_v * (int)*(short *)(puVar15 + uVar16 * 2) + (1 << cVar9 + 9) >>
                   cVar9 + 10;
          if (max_val <= iVar13) {
            iVar13 = max_val;
          }
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          local_8758[uVar16] = (pel)iVar13;
          uVar16 = uVar16 + 1;
        } while ((uint)width != uVar16);
      }
      local_8758 = local_8758 + i_dst;
      iVar12 = iVar12 + 1;
      puVar25 = puVar25 + lVar14;
      puVar22 = puVar22 + lVar14;
      puVar23 = puVar23 + lVar14;
      puVar21 = puVar21 + lVar14;
      puVar20 = puVar20 + lVar14;
      puVar18 = puVar18 + lVar14;
      puVar15 = puVar15 + lVar14;
      puVar17 = puVar17 + lVar14;
    } while (iVar12 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sum, val;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(128 + 7) * 128]);
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -3 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                sum = FLT_8TAP_HOR(src, col, coeff_h);
                tmp[col] = (sum + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                tmp[col] = FLT_8TAP_HOR(src, col, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 3 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_VER(tmp, col, width, coeff_v);
            val = (sum + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        dst += i_dst;
        tmp += width;
    }
}